

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTSerializer.cpp
# Opt level: O3

void __thiscall
slang::ast::ASTSerializer::visit<slang::ast::TypeAliasType>
          (ASTSerializer *this,TypeAliasType *elem,bool inMembersArray)

{
  flat_hash_set<const_void_*> *arrays_;
  size_t *psVar1;
  group_type_pointer pgVar2;
  byte bVar3;
  ulong uVar4;
  char *__s;
  SourceManager *this_00;
  group_type_pointer pgVar5;
  JsonWriter *pJVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  ulong uVar9;
  size_t sVar10;
  size_t sVar11;
  value_type *elements_1;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  byte bVar22;
  string_view sVar23;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar24;
  string_view name;
  string_view name_00;
  string_view value;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view value_00;
  locator res;
  TypeAliasType *local_90;
  ASTSerializer local_88;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  if (inMembersArray || this->detailedTypeInfo != false) {
    arrays_ = &this->visiting;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = elem;
    uVar16 = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar9 = uVar16 >> ((byte)(this->visiting).table_.
                             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                             .arrays.groups_size_index & 0x3f);
    local_88.visiting.table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
    .arrays.groups_size_mask._0_4_ =
         (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           match_word(unsigned_long)::word)[uVar16 & 0xff];
    uVar4 = (this->visiting).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
            .arrays.groups_size_mask;
    uVar13 = 0;
    uVar15 = uVar9;
    do {
      pgVar5 = (this->visiting).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
               .arrays.groups_ + uVar15;
      local_88.visiting.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
      .size_ctrl.size._0_1_ = pgVar5->m[0].n;
      local_88.visiting.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
      .size_ctrl.size._1_1_ = pgVar5->m[1].n;
      local_88.visiting.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
      .size_ctrl.size._2_1_ = pgVar5->m[2].n;
      local_88.visiting.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
      .size_ctrl.size._3_1_ = pgVar5->m[3].n;
      local_88.visiting.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
      .size_ctrl.size._4_1_ = pgVar5->m[4].n;
      local_88.visiting.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
      .size_ctrl.size._5_1_ = pgVar5->m[5].n;
      local_88.visiting.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
      .size_ctrl.size._6_1_ = pgVar5->m[6].n;
      local_88.visiting.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
      .size_ctrl.size._7_1_ = pgVar5->m[7].n;
      uStack_40 = pgVar5->m[8].n;
      uStack_3f = pgVar5->m[9].n;
      uStack_3e = pgVar5->m[10].n;
      bStack_3d = pgVar5->m[0xb].n;
      uStack_3c = pgVar5->m[0xc].n;
      uStack_3b = pgVar5->m[0xd].n;
      uStack_3a = pgVar5->m[0xe].n;
      bStack_39 = pgVar5->m[0xf].n;
      uVar19 = (uchar)(undefined4)
                      local_88.visiting.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                      .arrays.groups_size_mask;
      auVar17[0] = -((uchar)local_88.visiting.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                            .size_ctrl.size == uVar19);
      uVar20 = (uchar)((uint)(undefined4)
                             local_88.visiting.table_.
                             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                             .arrays.groups_size_mask >> 8);
      auVar17[1] = -(local_88.visiting.table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                     .size_ctrl.size._1_1_ == uVar20);
      uVar21 = (uchar)((uint)(undefined4)
                             local_88.visiting.table_.
                             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                             .arrays.groups_size_mask >> 0x10);
      auVar17[2] = -(local_88.visiting.table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                     .size_ctrl.size._2_1_ == uVar21);
      bVar22 = (byte)((uint)(undefined4)
                            local_88.visiting.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                            .arrays.groups_size_mask >> 0x18);
      auVar17[3] = -(local_88.visiting.table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                     .size_ctrl.size._3_1_ == bVar22);
      auVar17[4] = -(local_88.visiting.table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                     .size_ctrl.size._4_1_ == uVar19);
      auVar17[5] = -(local_88.visiting.table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                     .size_ctrl.size._5_1_ == uVar20);
      auVar17[6] = -(local_88.visiting.table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                     .size_ctrl.size._6_1_ == uVar21);
      auVar17[7] = -(local_88.visiting.table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                     .size_ctrl.size._7_1_ == bVar22);
      auVar17[8] = -(uStack_40 == uVar19);
      auVar17[9] = -(uStack_3f == uVar20);
      auVar17[10] = -(uStack_3e == uVar21);
      auVar17[0xb] = -(bStack_3d == bVar22);
      auVar17[0xc] = -(uStack_3c == uVar19);
      auVar17[0xd] = -(uStack_3b == uVar20);
      auVar17[0xe] = -(uStack_3a == uVar21);
      auVar17[0xf] = -(bStack_39 == bVar22);
      for (uVar12 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe); local_90 = elem,
          uVar12 != 0; uVar12 = uVar12 - 1 & uVar12) {
        uVar7 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
          }
        }
        if ((TypeAliasType *)
            (this->visiting).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
            .arrays.elements_[uVar15 * 0xf + (ulong)uVar7] == elem) {
          pJVar6 = this->writer;
          Type::toString_abi_cxx11_((string *)&local_88,&elem->super_Type);
          value_00._M_str._1_7_ = local_88.compilation._1_7_;
          value_00._M_str._0_1_ = local_88.compilation._0_1_;
          value_00._M_len = (size_t)local_88.writer;
          JsonWriter::writeValue(pJVar6,value_00);
          visit<slang::ast::TypeAliasType>(&local_88);
          return;
        }
      }
      bVar22 = (&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar16 & 7];
      if ((bVar22 & bStack_39) == 0) break;
      lVar14 = uVar15 + uVar13;
      uVar13 = uVar13 + 1;
      uVar15 = lVar14 + 1U & uVar4;
    } while (uVar13 <= uVar4);
    local_88.visiting.table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
    .arrays.groups_size_mask._4_4_ =
         (undefined4)
         local_88.visiting.table_.
         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
         .arrays.groups_size_mask;
    local_88.visiting.table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
    .arrays.groups_._0_4_ =
         (undefined4)
         local_88.visiting.table_.
         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
         .arrays.groups_size_mask;
    local_88.visiting.table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
    .arrays.groups_._4_4_ =
         (undefined4)
         local_88.visiting.table_.
         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
         .arrays.groups_size_mask;
    if ((this->visiting).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
        .size_ctrl.size <
        (this->visiting).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<void_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<void_const*>>
      ::nosize_unchecked_emplace_at<void_const*>
                ((locator *)&local_88,
                 (table_core<boost::unordered::detail::foa::flat_set_types<void_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<void_const*>>
                  *)arrays_,(arrays_type *)arrays_,uVar9,uVar16,&local_90);
      psVar1 = &(this->visiting).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<void_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<void_const*>>
      ::unchecked_emplace_with_rehash<void_const*>
                ((locator *)&local_88,
                 (table_core<boost::unordered::detail::foa::flat_set_types<void_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<void_const*>>
                  *)arrays_,uVar16,&local_90);
    }
    if ((elem->super_Type).super_Symbol.kind != TransparentMember) {
      JsonWriter::startObject(this->writer);
      sVar23 = (elem->super_Type).super_Symbol.name;
      name._M_str = "name";
      name._M_len = 4;
      JsonWriter::writeProperty(this->writer,name);
      JsonWriter::writeValue(this->writer,sVar23);
      __s = *(char **)(toString(slang::ast::SymbolKind)::strings +
                      (long)(int)(elem->super_Type).super_Symbol.kind * 8);
      sVar10 = strlen(__s);
      name_00._M_str = "kind";
      name_00._M_len = 4;
      JsonWriter::writeProperty(this->writer,name_00);
      value._M_str = __s;
      value._M_len = sVar10;
      JsonWriter::writeValue(this->writer,value);
      if ((this->includeSourceInfo == true) &&
         (this_00 = this->compilation->sourceManager, this_00 != (SourceManager *)0x0)) {
        sVar23 = SourceManager::getFileName(this_00,(elem->super_Type).super_Symbol.location);
        name_01._M_str = "source_file";
        name_01._M_len = 0xb;
        JsonWriter::writeProperty(this->writer,name_01);
        JsonWriter::writeValue(this->writer,sVar23);
        sVar11 = SourceManager::getLineNumber(this_00,(elem->super_Type).super_Symbol.location);
        name_02._M_str = "source_line";
        name_02._M_len = 0xb;
        JsonWriter::writeProperty(this->writer,name_02);
        JsonWriter::writeValue(this->writer,sVar11);
        sVar11 = SourceManager::getColumnNumber(this_00,(elem->super_Type).super_Symbol.location);
        name_03._M_str = "source_column";
        name_03._M_len = 0xd;
        JsonWriter::writeProperty(this->writer,name_03);
        JsonWriter::writeValue(this->writer,sVar11);
      }
      if (this->includeAddrs == true) {
        name_04._M_str = "addr";
        name_04._M_len = 4;
        JsonWriter::writeProperty(this->writer,name_04);
        JsonWriter::writeValue(this->writer,(uint64_t)elem);
      }
      sVar24 = Compilation::getAttributes(this->compilation,(Symbol *)elem);
      if (sVar24._M_extent._M_extent_value._M_extent_value != 0) {
        name_05._M_str = "attributes";
        name_05._M_len = 10;
        JsonWriter::writeProperty(this->writer,name_05);
        JsonWriter::startArray(this->writer);
        lVar14 = 0;
        do {
          local_88.compilation._0_1_ = 0;
          Symbol::visit<slang::ast::ASTSerializer&,bool&>
                    (*(Symbol **)((long)sVar24._M_ptr + lVar14),this,(bool *)&local_88);
          lVar14 = lVar14 + 8;
        } while (sVar24._M_extent._M_extent_value._M_extent_value << 3 != lVar14);
        JsonWriter::endArray(this->writer);
      }
      TypeAliasType::serializeTo(elem,this);
      JsonWriter::endObject(this->writer);
      uVar16 = uVar16 >> ((byte)(this->visiting).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                                .arrays.groups_size_index & 0x3f);
      pgVar5 = (this->visiting).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
               .arrays.groups_;
      uVar4 = (this->visiting).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
              .arrays.groups_size_mask;
      uVar15 = 0;
      do {
        pgVar2 = pgVar5 + uVar16;
        bVar3 = pgVar2->m[0xf].n;
        auVar18[0] = -(pgVar2->m[0].n ==
                      (uchar)local_88.visiting.table_.
                             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                             .arrays.groups_size_mask);
        auVar18[1] = -(pgVar2->m[1].n ==
                      local_88.visiting.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                      .arrays.groups_size_mask._1_1_);
        auVar18[2] = -(pgVar2->m[2].n ==
                      local_88.visiting.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                      .arrays.groups_size_mask._2_1_);
        auVar18[3] = -(pgVar2->m[3].n ==
                      local_88.visiting.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                      .arrays.groups_size_mask._3_1_);
        auVar18[4] = -(pgVar2->m[4].n ==
                      local_88.visiting.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                      .arrays.groups_size_mask._4_1_);
        auVar18[5] = -(pgVar2->m[5].n ==
                      local_88.visiting.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                      .arrays.groups_size_mask._5_1_);
        auVar18[6] = -(pgVar2->m[6].n ==
                      local_88.visiting.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                      .arrays.groups_size_mask._6_1_);
        auVar18[7] = -(pgVar2->m[7].n ==
                      local_88.visiting.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                      .arrays.groups_size_mask._7_1_);
        auVar18[8] = -(pgVar2->m[8].n ==
                      (uchar)local_88.visiting.table_.
                             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                             .arrays.groups_);
        auVar18[9] = -(pgVar2->m[9].n ==
                      local_88.visiting.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                      .arrays.groups_._1_1_);
        auVar18[10] = -(pgVar2->m[10].n ==
                       local_88.visiting.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                       .arrays.groups_._2_1_);
        auVar18[0xb] = -(pgVar2->m[0xb].n ==
                        local_88.visiting.table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                        .arrays.groups_._3_1_);
        auVar18[0xc] = -(pgVar2->m[0xc].n ==
                        local_88.visiting.table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                        .arrays.groups_._4_1_);
        auVar18[0xd] = -(pgVar2->m[0xd].n ==
                        local_88.visiting.table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                        .arrays.groups_._5_1_);
        auVar18[0xe] = -(pgVar2->m[0xe].n ==
                        local_88.visiting.table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                        .arrays.groups_._6_1_);
        auVar18[0xf] = -(bVar3 == local_88.visiting.table_.
                                  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                                  .arrays.groups_._7_1_);
        for (uVar12 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe); uVar12 != 0;
            uVar12 = uVar12 - 1 & uVar12) {
          uVar7 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
            }
          }
          uVar9 = (ulong)uVar7;
          if ((TypeAliasType *)
              (this->visiting).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
              .arrays.elements_[uVar16 * 0xf + uVar9] == elem) {
            bVar22 = (&boost::unordered::detail::foa::
                       group15<boost::unordered::detail::foa::plain_integral>::
                       is_not_overflowed(unsigned_long)::shift)[pgVar5[uVar16].m[uVar9].n & 7];
            bVar3 = *(byte *)((ulong)(pgVar5[uVar16].m + uVar9) | 0xf);
            pgVar5[uVar16].m[uVar9].n = '\0';
            sVar11 = (this->visiting).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                     .size_ctrl.size;
            (this->visiting).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
            .size_ctrl.ml =
                 (this->visiting).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                 .size_ctrl.ml - (ulong)((bVar22 & bVar3) != 0);
            (this->visiting).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
            .size_ctrl.size = sVar11 - 1;
            return;
          }
        }
        if ((bVar22 & bVar3) == 0) {
          return;
        }
        lVar14 = uVar16 + uVar15;
        uVar15 = uVar15 + 1;
        uVar16 = lVar14 + 1U & uVar4;
      } while (uVar15 <= uVar4);
    }
  }
  else {
    pJVar6 = this->writer;
    Type::toString_abi_cxx11_((string *)&local_88,&elem->super_Type);
    sVar23._M_str._1_7_ = local_88.compilation._1_7_;
    sVar23._M_str._0_1_ = local_88.compilation._0_1_;
    sVar23._M_len = (size_t)local_88.writer;
    JsonWriter::writeValue(pJVar6,sVar23);
    visit<slang::ast::TypeAliasType>(&local_88);
  }
  return;
}

Assistant:

void ASTSerializer::visit(const T& elem, bool inMembersArray) {
    if constexpr (std::is_base_of_v<Expression, T> || std::is_base_of_v<Statement, T> ||
                  std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                  std::is_base_of_v<AssertionExpr, T> || std::is_base_of_v<BinsSelectExpr, T> ||
                  std::is_base_of_v<Pattern, T>) {
        writer.startObject();
        if (elem.syntax && includeSourceInfo) {
            if (auto sm = compilation.getSourceManager()) {
                auto sr = elem.syntax->sourceRange();
                auto start = sm->getFullyExpandedLoc(sr.start());
                auto end = sm->getFullyExpandedLoc(sr.end());
                write("source_file_start", sm->getFileName(start));
                write("source_file_end", sm->getFileName(end));
                write("source_line_start", sm->getLineNumber(start));
                write("source_line_end", sm->getLineNumber(end));
                write("source_column_start", sm->getColumnNumber(start));
                write("source_column_end", sm->getColumnNumber(end));
            }
        }
    }
    if constexpr (std::is_base_of_v<Expression, T>) {
        write("kind", toString(elem.kind));
        write("type", *elem.type);
        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (!std::is_same_v<Expression, T>) {
            elem.serializeTo(*this);
        }

        if (tryConstantFold) {
            ASTContext ctx(compilation.getRoot(), LookupLocation::max);
            ConstantValue constant = ctx.tryEval(elem);
            if (constant)
                write("constant", constant);
        }
        else if (elem.constant) {
            write("constant", *elem.constant);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<Statement, T>) {
        write("kind", toString(elem.kind));

        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (!std::is_same_v<Statement, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                       std::is_base_of_v<AssertionExpr, T> ||
                       std::is_base_of_v<BinsSelectExpr, T> || std::is_base_of_v<Pattern, T>) {
        write("kind", toString(elem.kind));
        if constexpr (!std::is_same_v<TimingControl, T> && !std::is_same_v<Constraint, T> &&
                      !std::is_same_v<AssertionExpr, T> && !std::is_same_v<BinsSelectExpr, T> &&
                      !std::is_same_v<Pattern, T>) {
            elem.serializeTo(*this);
        }
        writer.endObject();
    }
    else {
        if constexpr (std::is_base_of_v<Type, T>) {
            // If we're not including detailed type info, we can just write the type name,
            // unless this a type alias, class, or covergroup. Otherwise we will fall through
            // and serialize full detailed type info.
            if (!detailedTypeInfo && (!inMembersArray || (!std::is_same_v<TypeAliasType, T> &&
                                                          !std::is_same_v<ClassType, T> &&
                                                          !std::is_same_v<CovergroupType, T>))) {
                writer.writeValue(elem.toString());
                return;
            }

            // Avoid infinite loops with recursive types.
            if (!visiting.insert(&elem).second) {
                writer.writeValue(elem.toString());
                return;
            }
        }

        // Skip uninstantiated blocks and instances.
        if constexpr (std::is_same_v<InstanceSymbol, T> ||
                      std::is_same_v<CheckerInstanceSymbol, T>) {
            if (elem.body.flags.has(InstanceFlags::Uninstantiated))
                return;
        }
        else if constexpr (std::is_same_v<GenerateBlockArraySymbol, T>) {
            if (!elem.valid)
                return;
        }
        else if constexpr (std::is_same_v<GenerateBlockSymbol, T>) {
            if (elem.isUninstantiated)
                return;
        }

        // Ignore built-in methods on class types.
        if constexpr (std::is_same_v<SubroutineSymbol, T>) {
            if (elem.flags.has(MethodFlags::BuiltIn | MethodFlags::Randomize))
                return;
        }

        // Ignore transparent members.
        if (elem.kind == SymbolKind::TransparentMember)
            return;

        writer.startObject();
        write("name", elem.name);
        write("kind", toString(elem.kind));
        if (includeSourceInfo) {
            if (auto sm = compilation.getSourceManager()) {
                write("source_file", sm->getFileName(elem.location));
                write("source_line", sm->getLineNumber(elem.location));
                write("source_column", sm->getColumnNumber(elem.location));
            }
        }

        if (includeAddrs)
            write("addr", uintptr_t(&elem));

        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (std::is_base_of_v<ValueSymbol, T>) {
            if (elem.kind != SymbolKind::EnumValue)
                write("type", elem.getType());

            if (auto init = elem.getInitializer())
                write("initializer", *init);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            if (!elem.empty()) {
                startArray("members");
                for (auto& member : elem.members())
                    serialize(member, /* inMembersArray */ true);
                endArray();
            }
        }

        if constexpr (!std::is_same_v<Symbol, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();

        if constexpr (std::is_base_of_v<Type, T>) {
            visiting.erase(&elem);
        }
    }
}